

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  float *pfVar6;
  float *pfVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  void *pvVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [16];
  float *outptr;
  Option opt_g;
  long local_138;
  Mat local_f0;
  undefined1 local_a8 [16];
  void *local_98;
  long local_90;
  InnerProduct *local_88;
  void *local_80;
  Option local_78;
  
  uVar10 = this->weight_data_size / this->num_output;
  uVar2 = bottom_blob->c;
  local_f0.elemsize = bottom_blob->elemsize;
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elempack = bottom_blob->elempack;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.dims = bottom_blob->dims;
  local_f0.w = bottom_blob->w;
  local_f0.h = bottom_blob->h;
  local_f0.d = bottom_blob->d;
  uVar3 = bottom_blob->w;
  uVar18 = bottom_blob->h;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  local_f0.c = uVar2;
  if (local_f0.elemsize != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    uVar23._0_1_ = opt->use_bf16_storage;
    uVar23._1_1_ = opt->use_fp16_packed;
    uVar23._2_1_ = opt->use_fp16_storage;
    uVar23._3_1_ = opt->use_fp16_arithmetic;
    uVar23._4_1_ = opt->use_int8_packed;
    uVar23._5_1_ = opt->use_int8_storage;
    uVar23._6_1_ = opt->use_int8_arithmetic;
    uVar23._7_1_ = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_0 = opt->use_reserved_0;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    local_78._32_8_ = uVar23 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_f0,&this->bottom_blob_int8_scales,&local_78);
  }
  if (bottom_blob->dims == 2) {
    iVar19 = this->num_output;
    if ((int)uVar18 < 2 || uVar3 != uVar10) goto LAB_002b77e3;
    Mat::create(top_blob,iVar19,uVar18,4,opt->blob_allocator);
    auVar28 = local_a8;
    local_80 = top_blob->data;
    iVar19 = -100;
    if ((local_80 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_002b7ab8;
    local_90 = (long)top_blob->w * top_blob->elemsize;
    uVar2 = this->num_output;
    iVar19 = this->bias_term;
    local_98 = (this->weight_data).data;
    pvVar5 = (this->weight_data_int8_scales).data;
    iVar4 = this->activation_type;
    local_a8._4_4_ = 0;
    local_a8._0_4_ = uVar18;
    local_a8._8_8_ = auVar28._8_8_;
    lVar11 = (long)local_f0.w * local_f0.elemsize;
    local_138 = 0;
    pvVar21 = local_f0.data;
    local_88 = this;
    do {
      pvVar16 = local_80;
      if (0 < (int)uVar2) {
        lVar17 = local_90 * local_138;
        pfVar6 = (float *)(local_88->bottom_blob_int8_scales).data;
        pfVar7 = (float *)(local_88->activation_params).data;
        pvVar8 = (local_88->bias_data).data;
        uVar23 = 0;
        pvVar22 = local_98;
        do {
          fVar26 = 0.0;
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar12 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + (int)*(char *)((long)pvVar22 + uVar12) *
                                (int)*(char *)((long)pvVar21 + uVar12);
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            fVar24 = (float)iVar13;
          }
          fVar1 = *(float *)((long)pvVar5 + uVar23 * 4);
          if (fVar1 != 0.0) {
            fVar26 = 1.0 / (fVar1 * *pfVar6);
          }
          fVar26 = fVar26 * fVar24;
          if (iVar19 != 0) {
            fVar26 = fVar26 + *(float *)((long)pvVar8 + uVar23 * 4);
          }
          fVar24 = fVar26;
          switch(iVar4) {
          case 1:
            if (fVar26 <= 0.0) {
              fVar24 = 0.0;
            }
            break;
          case 2:
            fVar24 = (float)(~-(uint)(0.0 < fVar26) & (uint)*pfVar7 |
                            -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
            break;
          case 3:
            if (fVar26 <= *pfVar7) {
              fVar26 = *pfVar7;
            }
            fVar24 = pfVar7[1];
            if (fVar26 <= pfVar7[1]) {
              fVar24 = fVar26;
            }
            break;
          case 4:
            if (88.37626 <= fVar26) {
              fVar26 = 88.37626;
            }
            fVar24 = expf((float)(-(uint)(fVar26 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar26 < -88.37626) & (uint)-fVar26));
            fVar24 = 1.0 / (fVar24 + 1.0);
            break;
          case 5:
            fVar24 = expf(fVar26);
            fVar24 = logf(fVar24 + 1.0);
            fVar24 = tanhf(fVar24);
            fVar24 = fVar24 * fVar26;
            break;
          case 6:
            fVar1 = *pfVar7;
            fVar25 = -pfVar7[1] / fVar1;
            fVar24 = 0.0;
            if ((fVar25 <= fVar26) && (fVar24 = fVar26, fVar26 <= fVar25 + 1.0 / fVar1)) {
              fVar24 = (fVar1 * fVar26 + pfVar7[1]) * fVar26;
            }
          }
          *(float *)((long)pvVar16 + uVar23 * 4 + lVar17) = fVar24;
          uVar23 = uVar23 + 1;
          pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar10);
        } while (uVar23 != uVar2);
      }
      local_138 = local_138 + 1;
      pvVar21 = (void *)((long)pvVar21 + lVar11);
    } while (local_138 != local_a8._0_8_);
  }
  else {
    iVar19 = this->num_output;
LAB_002b77e3:
    Mat::create(top_blob,iVar19,4,opt->blob_allocator);
    pvVar21 = local_f0.data;
    pvVar5 = top_blob->data;
    iVar19 = -100;
    if ((pvVar5 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_002b7ab8;
    iVar19 = this->num_output;
    if (0 < (long)iVar19) {
      uVar18 = uVar18 * uVar3;
      pvVar16 = (this->weight_data).data;
      pvVar8 = (this->weight_data_int8_scales).data;
      pfVar6 = (float *)(this->bottom_blob_int8_scales).data;
      iVar4 = this->bias_term;
      iVar13 = this->activation_type;
      pvVar22 = (this->bias_data).data;
      pfVar7 = (float *)(this->activation_params).data;
      lVar11 = local_f0.cstep * local_f0.elemsize;
      lVar17 = 0;
      do {
        fVar24 = 0.0;
        if (0 < (int)uVar2) {
          uVar23 = 0;
          iVar20 = 0;
          pvVar14 = pvVar21;
          pvVar15 = pvVar16;
          do {
            if (0 < (int)uVar18) {
              uVar12 = 0;
              do {
                iVar20 = iVar20 + (int)*(char *)((long)pvVar15 + uVar12) *
                                  (int)*(char *)((long)pvVar14 + uVar12);
                uVar12 = uVar12 + 1;
              } while (uVar18 != uVar12);
            }
            uVar23 = uVar23 + 1;
            pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar18);
            pvVar14 = (void *)((long)pvVar14 + lVar11);
          } while (uVar23 != uVar2);
          fVar24 = (float)iVar20;
        }
        fVar26 = *(float *)((long)pvVar8 + lVar17 * 4);
        auVar27 = ZEXT812(0);
        if (fVar26 != 0.0) {
          auVar27._4_8_ = 0;
          auVar27._0_4_ = 1.0 / (fVar26 * *pfVar6);
        }
        uVar23 = auVar27._4_8_;
        fVar24 = auVar27._0_4_ * fVar24;
        if (iVar4 != 0) {
          fVar24 = fVar24 + *(float *)((long)pvVar22 + lVar17 * 4);
        }
        auVar28._4_8_ = uVar23;
        auVar28._0_4_ = fVar24;
        auVar28._12_4_ = 0;
        switch(iVar13) {
        case 1:
          if (fVar24 <= 0.0) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar23;
            auVar28 = auVar9 << 0x20;
          }
        default:
switchD_002b7954_default:
          fVar26 = auVar28._0_4_;
          break;
        case 2:
          fVar26 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar7 |
                          -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
          break;
        case 3:
          if (fVar24 <= *pfVar7) {
            auVar28._0_4_ = *pfVar7;
            auVar28._12_4_ = 0;
          }
          fVar26 = pfVar7[1];
          if (auVar28._0_4_ <= fVar26) {
            fVar26 = auVar28._0_4_;
          }
          break;
        case 4:
          if (88.37626 <= fVar24) {
            fVar24 = 88.37626;
          }
          fVar24 = expf((float)(-(uint)(fVar24 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar24 < -88.37626) & (uint)-fVar24));
          fVar26 = 1.0 / (fVar24 + 1.0);
          break;
        case 5:
          local_a8 = auVar28;
          fVar24 = expf(fVar24);
          fVar24 = logf(fVar24 + 1.0);
          fVar24 = tanhf(fVar24);
          fVar26 = fVar24 * (float)local_a8._0_4_;
          break;
        case 6:
          fVar1 = *pfVar7;
          fVar25 = -pfVar7[1] / fVar1;
          fVar26 = 0.0;
          if (fVar25 <= fVar24) {
            if (fVar25 + 1.0 / fVar1 < fVar24) goto switchD_002b7954_default;
            fVar26 = (fVar1 * fVar24 + pfVar7[1]) * fVar24;
          }
        }
        *(float *)((long)pvVar5 + lVar17 * 4) = fVar26;
        lVar17 = lVar17 + 1;
        pvVar16 = (void *)((long)pvVar16 + (long)(int)(uVar18 * uVar2));
      } while (lVar17 != iVar19);
    }
  }
  iVar19 = 0;
LAB_002b7ab8:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if (local_f0.data != (void *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}